

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

void LineLineTieBreaker(ON_Line *line0,ON_Line *line1,ON_3dPoint *Q0,ON_3dPoint *Q1)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double *pdVar4;
  int i;
  int i_00;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  ON_3dPoint local_68;
  ON_3dPoint local_48;
  
  dVar7 = ON_Line::Length(line0);
  dVar8 = ON_Line::Length(line1);
  uVar5 = -(ulong)((line0->to).x == (line0->from).x);
  uVar6 = -(ulong)((line0->to).y == (line0->from).y);
  local_48.x = (double)(~uVar5 & 0xffe5f8bd9e331dd2 | (ulong)Q0->x & uVar5);
  local_48.y = (double)(~uVar6 & 0xffe5f8bd9e331dd2 | (ulong)Q0->y & uVar6);
  uVar5 = -(ulong)((line0->to).z == (line0->from).z);
  local_48.z = (double)(~uVar5 & 0xffe5f8bd9e331dd2 | (ulong)Q0->z & uVar5);
  bVar2 = ON_3dPoint::operator!=(&ON_3dPoint::UnsetPoint,&local_48);
  uVar5 = -(ulong)((line1->to).x == (line1->from).x);
  uVar6 = -(ulong)((line1->to).y == (line1->from).y);
  local_68.x = (double)(~uVar5 & 0xffe5f8bd9e331dd2 | (ulong)Q1->x & uVar5);
  local_68.y = (double)(~uVar6 & 0xffe5f8bd9e331dd2 | (ulong)Q1->y & uVar6);
  uVar5 = -(ulong)((line1->to).z == (line1->from).z);
  local_68.z = (double)(~uVar5 & 0xffe5f8bd9e331dd2 | (ulong)Q1->z & uVar5);
  bVar3 = ON_3dPoint::operator!=(&ON_3dPoint::UnsetPoint,&local_68);
  if ((bVar2) || (bVar3)) {
    i_00 = 0;
    do {
      pdVar4 = ON_3dPoint::operator[](&local_48,i_00);
      dVar9 = *pdVar4;
      pdVar4 = ON_3dPoint::operator[](&local_68,i_00);
      dVar1 = *pdVar4;
      if ((((dVar9 != -1.23432101234321e+308) || (NAN(dVar9))) || (dVar1 != -1.23432101234321e+308))
         || (NAN(dVar1))) {
        dVar11 = dVar9;
        if ((dVar9 == -1.23432101234321e+308) && (!NAN(dVar9))) {
          dVar11 = dVar1;
        }
        if ((dVar9 == dVar1) && (!NAN(dVar9) && !NAN(dVar1))) {
          dVar11 = dVar9;
        }
        dVar10 = (double)(~-(ulong)(dVar8 < dVar7) & (ulong)dVar1 |
                         -(ulong)(dVar8 < dVar7) & (ulong)dVar9);
        if ((dVar9 == dVar1) && (!NAN(dVar9) && !NAN(dVar1))) {
          dVar10 = dVar11;
        }
        if ((dVar9 == -1.23432101234321e+308) && (!NAN(dVar9))) {
          dVar10 = dVar11;
        }
        dVar9 = (double)(-(ulong)(dVar1 == -1.23432101234321e+308) & (ulong)dVar11 |
                        ~-(ulong)(dVar1 == -1.23432101234321e+308) & (ulong)dVar10);
        if ((dVar9 != -1.23432101234321e+308) || (NAN(dVar9))) {
          bVar2 = ON_IsValid(dVar9);
          if (bVar2) {
            pdVar4 = ON_3dPoint::operator[](Q0,i_00);
            *pdVar4 = dVar9;
            pdVar4 = ON_3dPoint::operator[](Q1,i_00);
            *pdVar4 = dVar9;
          }
        }
      }
      i_00 = i_00 + 1;
    } while (i_00 != 3);
  }
  return;
}

Assistant:

static void LineLineTieBreaker( const ON_Line& line0, const ON_Line& line1, 
                                ON_3dPoint& Q0, ON_3dPoint& Q1 )
{
  double line0_length = line0.Length();
  double line1_length = line1.Length();

  ON_3dPoint C0, C1;
  bool bHaveIsoCoords0 = GetLineIsoCoordinates(line0,Q0,C0);
  bool bHaveIsoCoords1 = GetLineIsoCoordinates(line1,Q1,C1);
  if ( bHaveIsoCoords0 || bHaveIsoCoords1 )
  {
    for ( int i = 0; i < 3; i++ )
    {
      double c0 = C0[i];
      double c1 = C1[i];
      if ( ON_UNSET_VALUE == c0 && ON_UNSET_VALUE == c1 )
        continue;
      double c = ON_UNSET_VALUE;
      if ( c0 == c1 )
        c = c0;
      else if ( ON_UNSET_VALUE == c0 )
        c = c1;
      else if ( ON_UNSET_VALUE == c1 )
        c = c0;
      else if ( line0_length > line1_length )
        c = c0;
      else
        c = c1;
      if ( ON_UNSET_VALUE != c && ON_IsValid(c) )
      {
        Q0[i] = c;
        Q1[i] = c;
      }
    }
  }
}